

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::scoped_padder>::format
          (source_location_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  size_t sVar3;
  size_t wrapped_size;
  char *buf_ptr;
  scoped_padder p;
  char local_49;
  scoped_padder local_48;
  
  uVar1 = (msg->source).line;
  if ((ulong)uVar1 == 0) {
    scoped_padder::scoped_padder(&local_48,0,&(this->super_flag_formatter).padinfo_,dest);
  }
  else {
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar3 = strlen((msg->source).filename);
      uVar2 = 0x1f;
      if ((uVar1 | 1) != 0) {
        for (; (uVar1 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      wrapped_size = sVar3 + ((ulong)uVar1 +
                              *(long *)(::fmt::v8::detail::do_count_digits(unsigned_int)::table +
                                       (ulong)uVar2 * 8) >> 0x20) + 1;
    }
    else {
      wrapped_size = 0;
    }
    scoped_padder::scoped_padder(&local_48,wrapped_size,&(this->super_flag_formatter).padinfo_,dest)
    ;
    __s = (msg->source).filename;
    sVar3 = strlen(__s);
    ::fmt::v8::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar3);
    local_49 = ':';
    ::fmt::v8::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_49);
    fmt_helper::append_int<int>((msg->source).line,dest);
  }
  scoped_padder::~scoped_padder(&local_48);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        size_t text_size;
        if (padinfo_.enabled())
        {
            // calc text size for padding based on "filename:line"
            text_size = std::char_traits<char>::length(msg.source.filename) + ScopedPadder::count_digits(msg.source.line) + 1;
        }
        else
        {
            text_size = 0;
        }

        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
        dest.push_back(':');
        fmt_helper::append_int(msg.source.line, dest);
    }